

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

_Bool is_close_frame(uint16_t status_code,_Bool status_code_required)

{
  long lVar1;
  uint16_t uVar2;
  size_t sVar3;
  undefined4 local_13;
  undefined1 local_f;
  uint16_t sc;
  undefined1 uStack_c;
  uint8_t mask [4];
  _Bool is_masked;
  uint8_t first_length;
  _Bool status_code_required_local;
  uint16_t status_code_local;
  
  if ((write_buffer[write_buffer_parse_pos] & 0x80) == 0x80) {
    if ((write_buffer[write_buffer_parse_pos] & 8) == 0) {
      mask[2] = '\0';
      write_buffer_parse_pos = write_buffer_parse_pos + 1;
    }
    else {
      sVar3 = write_buffer_parse_pos + 2;
      local_f = (write_buffer[write_buffer_parse_pos + 1] & 0x80) == 0x80;
      sc._0_1_ = write_buffer[write_buffer_parse_pos + 1] & 0x7f;
      if ((byte)sc < 0x7e) {
        if (((byte)sc == 0) && (status_code_required)) {
          mask[2] = '\0';
          write_buffer_parse_pos = sVar3;
        }
        else if ((byte)sc == 1) {
          mask[2] = '\0';
          write_buffer_parse_pos = sVar3;
        }
        else {
          if ((byte)sc != 0) {
            sc._1_1_ = status_code_required;
            _uStack_c = status_code;
            if ((bool)local_f) {
              local_13 = *(undefined4 *)(write_buffer + write_buffer_parse_pos + 2);
              lVar1 = write_buffer_parse_pos + 6;
              write_buffer_parse_pos = write_buffer_parse_pos + 6;
              cio_websocket_mask(write_buffer + lVar1,(ulong)(byte)sc,(uint8_t *)&local_13);
              sVar3 = write_buffer_parse_pos;
            }
            write_buffer_parse_pos = sVar3;
            uVar2 = cio_be16toh(*(uint16_t *)(write_buffer + write_buffer_parse_pos));
            sVar3 = (ulong)(byte)((byte)sc - 2) + write_buffer_parse_pos + 2;
            if (_uStack_c != uVar2) {
              write_buffer_parse_pos = sVar3;
              return false;
            }
          }
          write_buffer_parse_pos = sVar3;
          mask[2] = '\x01';
        }
      }
      else {
        mask[2] = '\0';
        write_buffer_parse_pos = sVar3;
      }
    }
  }
  else {
    mask[2] = '\0';
  }
  return (_Bool)mask[2];
}

Assistant:

static bool is_close_frame(uint16_t status_code, bool status_code_required)
{
	if ((write_buffer[write_buffer_parse_pos] & WS_HEADER_FIN) != WS_HEADER_FIN) {
		return false;
	}

	if ((write_buffer[write_buffer_parse_pos++] & WS_CLOSE_FRAME) == 0) {
		return false;
	}

	uint8_t first_length = write_buffer[write_buffer_parse_pos++];
	bool is_masked = ((first_length & WS_MASK_SET) == WS_MASK_SET);
	first_length = first_length & (uint8_t)~WS_MASK_SET;
	if (first_length > CIO_WEBSOCKET_SMALL_FRAME_SIZE) {
		return false;
	}

	if ((first_length == 0) && (status_code_required)) {
		return false;
	}

	if (first_length == 1) {
		return false;
	}

	if (first_length > 0) {
		if (is_masked) {
			uint8_t mask[4];
			memcpy(mask, &write_buffer[write_buffer_parse_pos], sizeof(mask));
			write_buffer_parse_pos += sizeof(mask);
			cio_websocket_mask(&write_buffer[write_buffer_parse_pos], first_length, mask);
		}

		uint16_t sc;
		memcpy(&sc, &write_buffer[write_buffer_parse_pos], sizeof(sc));
		sc = cio_be16toh(sc);
		write_buffer_parse_pos += sizeof(sc);
		first_length = (uint8_t)(first_length - sizeof(sc));
		write_buffer_parse_pos += first_length;
		if (status_code != sc) {
			return false;
		}
	}

	return true;
}